

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O2

void ImGuiStb::stb_textedit_delete
               (ImGuiTextEditState *str,STB_TexteditState *state,int where,int len)

{
  ImWchar IVar1;
  ImWchar *pIVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  pIVar2 = stb_text_createundo(&state->undostate,where,len,0);
  if (pIVar2 != (ImWchar *)0x0) {
    uVar3 = 0;
    if (0 < len) {
      uVar3 = (ulong)(uint)len;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      IVar1 = STB_TEXTEDIT_GETCHAR(str,where + (int)uVar4);
      pIVar2[uVar4] = IVar1;
    }
  }
  STB_TEXTEDIT_DELETECHARS(str,where,len);
  state->has_preferred_x = '\0';
  return;
}

Assistant:

static void stb_textedit_delete(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int len)
{
   stb_text_makeundo_delete(str, state, where, len);
   STB_TEXTEDIT_DELETECHARS(str, where, len);
   state->has_preferred_x = 0;
}